

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

uint format_Bpp(format_t format)

{
  uint uVar1;
  
  uVar1 = format + FORMAT_BGRA8888;
  if ((uVar1 < 9) && ((0x155U >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar1 = *(uint *)(&DAT_00136450 + (ulong)uVar1 * 4);
  }
  else {
    fprintf(_stderr,"%s: unknown format: %u\n",argv0);
    if (option_force == 0) {
      abort();
    }
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

unsigned int
format_Bpp(
    format_t format)
{
    switch ((int)format) {
    case FORMAT_RGBA8888:
    case FORMAT_BGRA8888:
        return 4;
    case FORMAT_ARGB4444:
    case FORMAT_RGB565:
        return 2;
    case FORMAT_GRAY8:
        return 1;
    default:
        fprintf(stderr, "%s: unknown format: %u\n", argv0, format);
        if (!option_force) abort();
        return 1;
    }
}